

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O0

exr_result_t
extract_chunk_leader
          (_internal_exr_context *ctxt,_internal_exr_part *part,int partnum,uint64_t offset,
          uint64_t *next_offset,priv_chunk_leader *leaderdata)

{
  exr_result_t eVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  int *in_R9;
  int64_t maxval;
  int ntoread;
  int rdcnt;
  uint64_t nextoffset;
  int32_t data [6];
  exr_result_t rv;
  long local_70;
  int local_68;
  int local_64;
  long local_60;
  int local_58 [7];
  int local_3c;
  int *local_38;
  long *local_30;
  int local_1c;
  long local_18;
  long local_10;
  
  local_3c = 0;
  local_70 = 0x7fffffff;
  if (0 < *(long *)(in_RDI + 0x98)) {
    local_70 = *(long *)(in_RDI + 0x98);
  }
  if ((*(int *)(in_RSI + 4) == 0) || (*(int *)(in_RSI + 4) == 2)) {
    local_68 = 1;
    if (*(char *)(in_RDI + 5) != '\0') {
      local_68 = 2;
    }
    if (*(int *)(in_RSI + 4) != 2) {
      local_68 = local_68 + 1;
    }
  }
  else if (*(int *)(in_RSI + 4) == 3) {
    if (*(char *)(in_RDI + 5) == '\0') {
      local_68 = 4;
    }
    else {
      local_68 = 5;
    }
  }
  else if (*(char *)(in_RDI + 5) == '\0') {
    local_68 = 5;
  }
  else {
    local_68 = 6;
  }
  local_60 = in_RCX;
  local_38 = in_R9;
  local_30 = in_R8;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_3c = (**(code **)(in_RDI + 0x28))(in_RDI,local_58,(long)local_68 << 2,&local_60,0,0);
  if (local_3c != 0) {
    return local_3c;
  }
  priv_to_native32(local_58,local_68);
  local_64 = 0;
  if (*(char *)(local_10 + 5) == '\0') {
    *local_38 = 0;
  }
  else {
    if (local_58[0] != local_1c) {
      eVar1 = (**(code **)(local_10 + 0x48))
                        (local_10,0x16,
                         "Invalid part number reconstructing chunk table: expect %d, found %d",
                         local_1c,local_58[0]);
      return eVar1;
    }
    *local_38 = local_1c;
    local_64 = 1;
  }
  if ((*(int *)(local_18 + 4) == 0) || (*(int *)(local_18 + 4) == 2)) {
    local_38[1] = local_58[local_64];
  }
  else {
    local_38[1] = local_58[local_64];
    iVar2 = local_64 + 2;
    local_38[2] = local_58[local_64 + 1];
    local_64 = local_64 + 3;
    local_38[3] = local_58[iVar2];
    local_38[4] = local_58[local_64];
  }
  if ((*(int *)(local_18 + 4) == 2) || (*(int *)(local_18 + 4) == 3)) {
    local_3c = (**(code **)(local_10 + 0x28))(local_10,local_38 + 6,0x18,&local_60,0,0);
    if (local_3c != 0) {
      return local_3c;
    }
    priv_to_native64(local_38 + 6,3);
    if ((*(long *)(local_38 + 8) < 0) || (local_70 < *(long *)(local_38 + 8))) {
      eVar1 = (**(code **)(local_10 + 0x48))
                        (local_10,0x16,
                         "Invalid chunk size reconstructing chunk table: found out of range %ld",
                         *(undefined8 *)(local_38 + 8));
      return eVar1;
    }
    *(undefined8 *)(local_38 + 0xc) = *(undefined8 *)(local_38 + 8);
    local_60 = *(long *)(local_38 + 8) + local_60;
  }
  else {
    local_64 = local_64 + 1;
    if ((local_58[local_64] < 0) || (local_70 < local_58[local_64])) {
      eVar1 = (**(code **)(local_10 + 0x48))
                        (local_10,0x16,
                         "Invalid chunk size reconstructing chunk table: found out of range %d",
                         local_58[local_64]);
      return eVar1;
    }
    *(long *)(local_38 + 0xc) = (long)local_58[local_64];
    local_60 = *(long *)(local_38 + 0xc) + local_60;
  }
  *local_30 = local_60;
  return local_3c;
}

Assistant:

static exr_result_t
extract_chunk_leader (
    const struct _internal_exr_context* ctxt,
    const struct _internal_exr_part*    part,
    int                                 partnum,
    uint64_t                            offset,
    uint64_t*                           next_offset,
    struct priv_chunk_leader*           leaderdata)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    int32_t      data[6];
    uint64_t     nextoffset = offset;
    int          rdcnt, ntoread;
    int64_t      maxval = (int64_t) INT_MAX; // 2GB

    if (ctxt->file_size > 0) maxval = ctxt->file_size;

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        ntoread = (ctxt->is_multipart) ? 2 : 1;
        if (part->storage_mode != EXR_STORAGE_DEEP_SCANLINE) ++ntoread;
    }
    else if (part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (ctxt->is_multipart)
            ntoread = 5;
        else
            ntoread = 4;
    }
    else if (ctxt->is_multipart)
        ntoread = 6;
    else
        ntoread = 5;

    rv = ctxt->do_read (
        ctxt,
        data,
        ntoread * sizeof (int32_t),
        &nextoffset,
        NULL,
        EXR_MUST_READ_ALL);
    if (rv != EXR_ERR_SUCCESS) return rv;

    priv_to_native32 (data, ntoread);

    rdcnt = 0;
    if (ctxt->is_multipart)
    {
        if (data[rdcnt] != partnum)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid part number reconstructing chunk table: expect %d, found %d",
                partnum,
                data[rdcnt]);
        }
        leaderdata->partnum = partnum;
        ++rdcnt;
    }
    else
        leaderdata->partnum = 0;

    if (part->storage_mode == EXR_STORAGE_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
    {
        leaderdata->scanline_y = data[rdcnt];
    }
    else
    {
        leaderdata->tile_x  = data[rdcnt++];
        leaderdata->tile_y  = data[rdcnt++];
        leaderdata->level_x = data[rdcnt++];
        leaderdata->level_y = data[rdcnt];
    }

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        rv = ctxt->do_read (
            ctxt,
            leaderdata->deep_data,
            3 * sizeof (int64_t),
            &nextoffset,
            NULL,
            EXR_MUST_READ_ALL);
        if (rv != EXR_ERR_SUCCESS) return rv;
        priv_to_native64 (leaderdata->deep_data, 3);

        if (leaderdata->deep_data[1] < 0 || leaderdata->deep_data[1] > maxval)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid chunk size reconstructing chunk table: found out of range %" PRId64,
                leaderdata->deep_data[1]);
        }
        leaderdata->packed_size = leaderdata->deep_packed_size;
        nextoffset += leaderdata->deep_packed_size;
    }
    else
    {
        ++rdcnt;

        if (data[rdcnt] < 0 || data[rdcnt] > maxval)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_BAD_CHUNK_LEADER,
                "Invalid chunk size reconstructing chunk table: found out of range %d",
                data[rdcnt]);
        }
        leaderdata->packed_size = (uint64_t) data[rdcnt];
        nextoffset += leaderdata->packed_size;
    }

    *next_offset = nextoffset;
    return rv;
}